

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTest::createInstance
          (PushConstantComputeTest *this,Context *context)

{
  Context **ppCVar1;
  Context **ppCVar2;
  undefined8 uVar3;
  void *pvVar4;
  VkDescriptorPool VVar5;
  undefined8 uVar6;
  VkDeviceSize VVar7;
  Context **ppCVar8;
  Handle<(vk::HandleType)22> HVar9;
  DeviceInterface *pDVar10;
  VkDevice pVVar11;
  Handle<(vk::HandleType)16> HVar12;
  VkAllocationCallbacks *pVVar13;
  VkResult VVar14;
  TestInstance *pTVar15;
  DeviceInterface *vk;
  VkDevice device;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  const_iterator cVar16;
  Context **ppCVar17;
  Context *pCVar18;
  VkDescriptorSetAllocateInfo allocInfo;
  VkBufferCreateInfo bufferCreateInfo;
  deUint32 queueFamilyIndex;
  Context **local_500;
  Context **local_4f8;
  Context **local_4f0;
  Context **local_4e8;
  Context **local_4e0;
  Move<vk::Handle<(vk::HandleType)22>_> local_4d8;
  Context **local_4b8;
  Context **local_4b0;
  Move<vk::Handle<(vk::HandleType)16>_> local_4a8;
  _func_int **local_480;
  deUint32 local_478;
  VkDescriptorBufferInfo descriptorInfo;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkShaderModule local_428;
  pointer local_418;
  SimpleAllocator memAlloc;
  
  pTVar15 = (TestInstance *)operator_new(0x178);
  pCVar18 = *(Context **)&(this->m_pushConstantRange).range.size;
  pTVar15[1]._vptr_TestInstance = *(_func_int ***)&(this->m_pushConstantRange).range;
  pTVar15[1].m_context = pCVar18;
  *(deUint32 *)&pTVar15[2]._vptr_TestInstance = (this->m_pushConstantRange).update.size;
  pTVar15->m_context = context;
  pTVar15->_vptr_TestInstance = (_func_int **)&PTR__PushConstantComputeTestInstance_00d27fb8;
  local_4e0 = &pTVar15[2].m_context;
  local_4f0 = &pTVar15[5].m_context;
  ppCVar17 = &pTVar15[7].m_context;
  ppCVar1 = &pTVar15[9].m_context;
  local_4e8 = &pTVar15[0xb].m_context;
  local_500 = &pTVar15[0xd].m_context;
  local_4f8 = &pTVar15[0xf].m_context;
  local_4b8 = &pTVar15[0x11].m_context;
  ppCVar2 = &pTVar15[0x13].m_context;
  local_4b0 = &pTVar15[0x15].m_context;
  pTVar15[2].m_context = (Context *)0x0;
  pTVar15[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar15[3].m_context = (Context *)0x0;
  pTVar15[4]._vptr_TestInstance = (_func_int **)0x0;
  pTVar15[4].m_context = (Context *)0x0;
  memset(local_4f0,0,0x120);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  vk_00 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&pipelineLayoutParams,vk_00,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&memAlloc,vk,device,(VkPhysicalDeviceMemoryProperties *)&pipelineLayoutParams);
  local_480 = pTVar15[1]._vptr_TestInstance;
  local_478 = *(deUint32 *)&pTVar15[1].m_context;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&pipelineLayoutParams);
  ppCVar8 = local_4e0;
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&pipelineLayoutParams,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&allocInfo,this_00,vk,device,0);
  uVar6 = allocInfo._24_8_;
  VVar5 = allocInfo.descriptorPool;
  pvVar4 = allocInfo.pNext;
  uVar3 = allocInfo._0_8_;
  bufferCreateInfo._16_8_ = allocInfo.descriptorPool.m_internal;
  bufferCreateInfo.size = allocInfo._24_8_;
  bufferCreateInfo.sType = allocInfo.sType;
  bufferCreateInfo._4_4_ = allocInfo._4_4_;
  bufferCreateInfo.pNext = allocInfo.pNext;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = 0;
  allocInfo.descriptorSetCount = 0;
  allocInfo._28_4_ = 0;
  if (*ppCVar17 == (Context *)0x0) {
    pTVar15[8].m_context = (Context *)VVar5.m_internal;
    pTVar15[9]._vptr_TestInstance = (_func_int **)uVar6;
    *ppCVar17 = (Context *)uVar3;
    pTVar15[8]._vptr_TestInstance = (_func_int **)pvVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(pTVar15 + 8),
               (VkDescriptorSetLayout)*ppCVar17);
    pTVar15[8].m_context = (Context *)bufferCreateInfo._16_8_;
    pTVar15[9]._vptr_TestInstance = (_func_int **)bufferCreateInfo.size;
    *ppCVar17 = (Context *)bufferCreateInfo._0_8_;
    pTVar15[8]._vptr_TestInstance = (_func_int **)bufferCreateInfo.pNext;
    if (allocInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)&allocInfo.pNext,
                 (VkDescriptorSetLayout)allocInfo._0_8_);
    }
  }
  allocInfo.descriptorPool.m_internal = 0;
  allocInfo.descriptorSetCount = 0;
  allocInfo._28_4_ = 0;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)0x0;
  if ((pointer)local_428.m_internal != (pointer)0x0) {
    operator_delete((void *)local_428.m_internal,(long)local_418 - local_428.m_internal);
  }
  if (pipelineLayoutParams.pSetLayouts != (VkDescriptorSetLayout *)0x0) {
    operator_delete(pipelineLayoutParams.pSetLayouts,
                    (long)pipelineLayoutParams.pPushConstantRanges -
                    (long)pipelineLayoutParams.pSetLayouts);
  }
  if (pipelineLayoutParams._0_8_ != 0) {
    operator_delete((void *)pipelineLayoutParams._0_8_,
                    pipelineLayoutParams._16_8_ - pipelineLayoutParams._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&allocInfo);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&allocInfo,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferCreateInfo,this_01,vk,device,1,1);
  VVar7 = bufferCreateInfo.size;
  uVar6 = bufferCreateInfo._16_8_;
  pvVar4 = bufferCreateInfo.pNext;
  uVar3 = bufferCreateInfo._0_8_;
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (*local_4f0 == (Context *)0x0) {
    local_4f0[2] = (Context *)uVar6;
    local_4f0[3] = (Context *)VVar7;
    *local_4f0 = (Context *)uVar3;
    local_4f0[1] = (Context *)pvVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(pTVar15 + 6),
               (VkDescriptorPool)*local_4f0);
    local_4f0[2] = (Context *)pipelineLayoutParams._16_8_;
    local_4f0[3] = (Context *)pipelineLayoutParams.pSetLayouts;
    *local_4f0 = (Context *)pipelineLayoutParams._0_8_;
    local_4f0[1] = (Context *)pipelineLayoutParams.pNext;
    if (bufferCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&bufferCreateInfo.pNext,
                 (VkDescriptorPool)bufferCreateInfo._0_8_);
    }
  }
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  if (allocInfo._0_8_ != 0) {
    operator_delete((void *)allocInfo._0_8_,allocInfo.descriptorPool.m_internal - allocInfo._0_8_);
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = bufferCreateInfo._16_8_ & 0xffffffff00000000;
  bufferCreateInfo.size = 0x80;
  bufferCreateInfo.usage = 0x20;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 1;
  bufferCreateInfo.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&allocInfo,vk,device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  uVar6 = allocInfo._24_8_;
  VVar5 = allocInfo.descriptorPool;
  pvVar4 = allocInfo.pNext;
  uVar3 = allocInfo._0_8_;
  pipelineLayoutParams.flags = (undefined4)allocInfo.descriptorPool.m_internal;
  pipelineLayoutParams.setLayoutCount = allocInfo.descriptorPool.m_internal._4_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)allocInfo._24_8_;
  pipelineLayoutParams.sType = allocInfo.sType;
  pipelineLayoutParams._4_4_ = allocInfo._4_4_;
  pipelineLayoutParams.pNext = allocInfo.pNext;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = 0;
  allocInfo.descriptorSetCount = 0;
  allocInfo._28_4_ = 0;
  if (*ppCVar8 == (Context *)0x0) {
    ppCVar8[2] = (Context *)VVar5.m_internal;
    ppCVar8[3] = (Context *)uVar6;
    *ppCVar8 = (Context *)uVar3;
    ppCVar8[1] = (Context *)pvVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(pTVar15 + 3),(VkBuffer)*ppCVar8);
    ppCVar8[2] = (Context *)pipelineLayoutParams._16_8_;
    ppCVar8[3] = (Context *)pipelineLayoutParams.pSetLayouts;
    *ppCVar8 = (Context *)pipelineLayoutParams._0_8_;
    ppCVar8[1] = (Context *)pipelineLayoutParams.pNext;
    if (allocInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&allocInfo.pNext,
                 (VkBuffer)allocInfo._0_8_);
    }
  }
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&pipelineLayoutParams,vk,device,(VkBuffer)*ppCVar8);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&allocInfo,&memAlloc,
             (VkMemoryRequirements *)&pipelineLayoutParams,(MemoryRequirement)0x1);
  uVar3 = allocInfo._0_8_;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  pCVar18 = pTVar15[4].m_context;
  if (pCVar18 != (Context *)uVar3) {
    if (pCVar18 == (Context *)0x0) {
      pTVar15[4].m_context = (Context *)uVar3;
      pCVar18 = (Context *)uVar3;
    }
    else {
      (*(code *)pCVar18->m_testCtx->m_rootArchive)();
      pTVar15[4].m_context = (Context *)uVar3;
      pCVar18 = (Context *)uVar3;
      if (allocInfo._0_8_ != 0) {
        (**(code **)(*(long *)allocInfo._0_8_ + 8))();
        pCVar18 = pTVar15[4].m_context;
      }
    }
  }
  VVar14 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,*local_4e0,pCVar18->m_platformInterface,pCVar18->m_progCollection);
  ::vk::checkResult(VVar14,
                    "vk.bindBufferMemory(vkDevice, *m_outBuffer, m_outBufferAlloc->getMemory(), m_outBufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x596);
  allocInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = (deUint64)*local_4f0;
  allocInfo.descriptorSetCount = 1;
  allocInfo.pSetLayouts = (VkDescriptorSetLayout *)ppCVar17;
  ::vk::allocateDescriptorSet(&local_4d8,vk,device,&allocInfo);
  VVar5.m_internal =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
  pVVar11 = local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  pDVar10 = local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
  HVar9.m_internal =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  ppCVar8 = local_4e0;
  pipelineLayoutParams._16_8_ =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  pipelineLayoutParams.pSetLayouts =
       (VkDescriptorSetLayout *)
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
  pipelineLayoutParams._0_8_ =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  pipelineLayoutParams.pNext =
       local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
  if (*ppCVar1 == (Context *)0x0) {
    pTVar15[10].m_context = (Context *)pVVar11;
    pTVar15[0xb]._vptr_TestInstance = (_func_int **)VVar5.m_internal;
    *ppCVar1 = (Context *)HVar9.m_internal;
    pTVar15[10]._vptr_TestInstance = (_func_int **)pDVar10;
  }
  else {
    local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
         (deUint64)*ppCVar1;
    (**(code **)(*pTVar15[10]._vptr_TestInstance + 0x1e8))
              (pTVar15[10]._vptr_TestInstance,pTVar15[10].m_context,pTVar15[0xb]._vptr_TestInstance,
               1);
    *(VkPipelineLayoutCreateFlags *)&pTVar15[10].m_context = pipelineLayoutParams.flags;
    *(deUint32 *)((long)&pTVar15[10].m_context + 4) = pipelineLayoutParams.setLayoutCount;
    *(undefined4 *)&pTVar15[0xb]._vptr_TestInstance = pipelineLayoutParams.pSetLayouts._0_4_;
    *(undefined4 *)((long)&pTVar15[0xb]._vptr_TestInstance + 4) =
         pipelineLayoutParams.pSetLayouts._4_4_;
    *(VkStructureType *)ppCVar1 = pipelineLayoutParams.sType;
    *(undefined4 *)((long)&pTVar15[9].m_context + 4) = pipelineLayoutParams._4_4_;
    *(undefined4 *)&pTVar15[10]._vptr_TestInstance = pipelineLayoutParams.pNext._0_4_;
    *(undefined4 *)((long)&pTVar15[10]._vptr_TestInstance + 4) = pipelineLayoutParams.pNext._4_4_;
    if (local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
      pipelineLayoutParams._0_8_ =
           local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
      (*(local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                 m_deviceIface,
                 local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
                 local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                 m_internal);
    }
  }
  descriptorInfo.buffer.m_internal = (deUint64)*ppCVar8;
  descriptorInfo.offset = 0;
  descriptorInfo.range = 0x80;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&pipelineLayoutParams);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&pipelineLayoutParams,(int)*ppCVar1,(void *)0x0
                       ,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if ((pointer)local_428.m_internal != (pointer)0x0) {
    operator_delete((void *)local_428.m_internal,(long)local_418 - local_428.m_internal);
  }
  if (pipelineLayoutParams.pSetLayouts != (VkDescriptorSetLayout *)0x0) {
    operator_delete(pipelineLayoutParams.pSetLayouts,
                    (long)pipelineLayoutParams.pPushConstantRanges -
                    (long)pipelineLayoutParams.pSetLayouts);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&pipelineLayoutParams);
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 1;
  pipelineLayoutParams.pushConstantRangeCount = 1;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)&local_480;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)ppCVar17;
  ::vk::createPipelineLayout
            (&local_4a8,vk,device,&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  pVVar13 = local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  pVVar11 = local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  pDVar10 = local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  HVar12.m_internal =
       local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  ppCVar17 = local_4e8;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       (deUint64)local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
  ;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal = 0;
  local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (*local_4e8 == (Context *)0x0) {
    local_4e8[2] = (Context *)pVVar11;
    local_4e8[3] = (Context *)pVVar13;
    *local_4e8 = (Context *)HVar12.m_internal;
    local_4e8[1] = (Context *)pDVar10;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(pTVar15 + 0xc),
               (VkPipelineLayout)*local_4e8);
    ppCVar17[2] = (Context *)
                  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
    ppCVar17[3] = (Context *)
                  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                  m_internal;
    *ppCVar17 = (Context *)
                local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    ppCVar17[1] = (Context *)
                  local_4d8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                  m_deviceIface;
    if (local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                (&local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
                 (VkPipelineLayout)
                 local_4a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
    }
  }
  allocInfo.pNext = (void *)0x7;
  allocInfo.descriptorPool.m_internal = 0x657475706d6f63;
  allocInfo._0_8_ = &allocInfo.descriptorPool;
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)pTVar15->m_context->m_progCollection,(key_type *)&allocInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar16._M_node + 2),0);
  VVar7 = bufferCreateInfo.size;
  uVar6 = bufferCreateInfo._16_8_;
  pvVar4 = bufferCreateInfo.pNext;
  uVar3 = bufferCreateInfo._0_8_;
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (*local_4f8 == (Context *)0x0) {
    local_4f8[2] = (Context *)uVar6;
    local_4f8[3] = (Context *)VVar7;
    *local_4f8 = (Context *)uVar3;
    local_4f8[1] = (Context *)pvVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(pTVar15 + 0x10),
               (VkShaderModule)*local_4f8);
    local_4f8[2] = (Context *)pipelineLayoutParams._16_8_;
    local_4f8[3] = (Context *)pipelineLayoutParams.pSetLayouts;
    *local_4f8 = (Context *)pipelineLayoutParams._0_8_;
    local_4f8[1] = (Context *)pipelineLayoutParams.pNext;
    if (bufferCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo.pNext,
                 (VkShaderModule)bufferCreateInfo._0_8_);
    }
  }
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  if ((VkDescriptorPool *)allocInfo._0_8_ != &allocInfo.descriptorPool) {
    operator_delete((void *)allocInfo._0_8_,allocInfo.descriptorPool.m_internal + 1);
  }
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams._16_8_ = pipelineLayoutParams._16_8_ & 0xffffffff00000000;
  pipelineLayoutParams.pSetLayouts =
       (VkDescriptorSetLayout *)CONCAT44(pipelineLayoutParams.pSetLayouts._4_4_,0x12);
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams._36_4_ = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)0x2000000000;
  ::vk::createComputePipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&allocInfo,vk,device,(VkPipelineCache)0x0,
             (VkComputePipelineCreateInfo *)&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  uVar6 = allocInfo._24_8_;
  VVar5 = allocInfo.descriptorPool;
  pvVar4 = allocInfo.pNext;
  uVar3 = allocInfo._0_8_;
  bufferCreateInfo._16_8_ = allocInfo.descriptorPool.m_internal;
  bufferCreateInfo.size = allocInfo._24_8_;
  bufferCreateInfo.sType = allocInfo.sType;
  bufferCreateInfo._4_4_ = allocInfo._4_4_;
  bufferCreateInfo.pNext = allocInfo.pNext;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal = 0;
  allocInfo.descriptorSetCount = 0;
  allocInfo._28_4_ = 0;
  if (*local_500 == (Context *)0x0) {
    local_500[2] = (Context *)VVar5.m_internal;
    local_500[3] = (Context *)uVar6;
    *local_500 = (Context *)uVar3;
    local_500[1] = (Context *)pvVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(pTVar15 + 0xe),(VkPipeline)*local_500);
    local_500[2] = (Context *)bufferCreateInfo._16_8_;
    local_500[3] = (Context *)bufferCreateInfo.size;
    *local_500 = (Context *)bufferCreateInfo._0_8_;
    local_500[1] = (Context *)bufferCreateInfo.pNext;
    if (allocInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&allocInfo.pNext,
                 (VkPipeline)allocInfo._0_8_);
    }
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,1,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  VVar7 = bufferCreateInfo.size;
  uVar6 = bufferCreateInfo._16_8_;
  pvVar4 = bufferCreateInfo.pNext;
  uVar3 = bufferCreateInfo._0_8_;
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (*local_4b8 == (Context *)0x0) {
    local_4b8[2] = (Context *)uVar6;
    local_4b8[3] = (Context *)VVar7;
    *local_4b8 = (Context *)uVar3;
    local_4b8[1] = (Context *)pvVar4;
    ppCVar17 = local_4b8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(pTVar15 + 0x12),
               (VkCommandPool)*local_4b8);
    ppCVar17 = local_4b8;
    local_4b8[2] = (Context *)pipelineLayoutParams._16_8_;
    local_4b8[3] = (Context *)pipelineLayoutParams.pSetLayouts;
    *local_4b8 = (Context *)pipelineLayoutParams._0_8_;
    local_4b8[1] = (Context *)pipelineLayoutParams.pNext;
    if (bufferCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo.pNext,
                 (VkCommandPool)bufferCreateInfo._0_8_);
    }
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,(VkCommandPool)*ppCVar17,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar7 = bufferCreateInfo.size;
  uVar6 = bufferCreateInfo._16_8_;
  pvVar4 = bufferCreateInfo.pNext;
  uVar3 = bufferCreateInfo._0_8_;
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (*ppCVar2 == (Context *)0x0) {
    pTVar15[0x14].m_context = (Context *)uVar6;
    pTVar15[0x15]._vptr_TestInstance = (_func_int **)VVar7;
    *ppCVar2 = (Context *)uVar3;
    pTVar15[0x14]._vptr_TestInstance = (_func_int **)pvVar4;
  }
  else {
    allocInfo._0_8_ = *ppCVar2;
    (**(code **)(*pTVar15[0x14]._vptr_TestInstance + 0x240))
              (pTVar15[0x14]._vptr_TestInstance,pTVar15[0x14].m_context,
               pTVar15[0x15]._vptr_TestInstance,1);
    *(VkPipelineLayoutCreateFlags *)&pTVar15[0x14].m_context = pipelineLayoutParams.flags;
    *(deUint32 *)((long)&pTVar15[0x14].m_context + 4) = pipelineLayoutParams.setLayoutCount;
    *(undefined4 *)&pTVar15[0x15]._vptr_TestInstance = pipelineLayoutParams.pSetLayouts._0_4_;
    *(undefined4 *)((long)&pTVar15[0x15]._vptr_TestInstance + 4) =
         pipelineLayoutParams.pSetLayouts._4_4_;
    *(VkStructureType *)ppCVar2 = pipelineLayoutParams.sType;
    *(undefined4 *)((long)&pTVar15[0x13].m_context + 4) = pipelineLayoutParams._4_4_;
    *(undefined4 *)&pTVar15[0x14]._vptr_TestInstance = pipelineLayoutParams.pNext._0_4_;
    *(undefined4 *)((long)&pTVar15[0x14]._vptr_TestInstance + 4) = pipelineLayoutParams.pNext._4_4_;
    if (bufferCreateInfo._0_8_ != 0) {
      pipelineLayoutParams.sType = bufferCreateInfo.sType;
      pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
      (**(code **)(*bufferCreateInfo.pNext + 0x240))
                (bufferCreateInfo.pNext,bufferCreateInfo._16_8_,bufferCreateInfo.size,1);
    }
  }
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 0;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x0;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  pipelineLayoutParams._4_4_ = 0;
  pipelineLayoutParams.pNext = (void *)0x0;
  VVar14 = (*vk->_vptr_DeviceInterface[0x49])(vk,*ppCVar2);
  ::vk::checkResult(VVar14,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x5e4);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,*ppCVar2,1,*local_500);
  (*vk->_vptr_DeviceInterface[0x56])(vk,*ppCVar2,1,*local_4e8,0,1,ppCVar1,0,0);
  bufferCreateInfo.sType = 0x3f800000;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x3f80000000000000;
  (*vk->_vptr_DeviceInterface[0x73])
            (vk,pTVar15[0x13].m_context,pTVar15[0xb].m_context,
             (ulong)*(uint *)&pTVar15[1]._vptr_TestInstance,
             (ulong)*(uint *)((long)&pTVar15[1]._vptr_TestInstance + 4),
             (ulong)*(uint *)&pTVar15[1].m_context,&bufferCreateInfo);
  (*vk->_vptr_DeviceInterface[0x5d])(vk,*ppCVar2,8,1);
  VVar14 = (*vk->_vptr_DeviceInterface[0x4a])(vk,*ppCVar2);
  ::vk::checkResult(VVar14,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelinePushConstantTests.cpp"
                    ,0x5ef);
  ppCVar17 = local_4b0;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&bufferCreateInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  VVar7 = bufferCreateInfo.size;
  uVar6 = bufferCreateInfo._16_8_;
  pvVar4 = bufferCreateInfo.pNext;
  uVar3 = bufferCreateInfo._0_8_;
  pipelineLayoutParams.flags = bufferCreateInfo.flags;
  pipelineLayoutParams.setLayoutCount = bufferCreateInfo._20_4_;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)bufferCreateInfo.size;
  pipelineLayoutParams.sType = bufferCreateInfo.sType;
  pipelineLayoutParams._4_4_ = bufferCreateInfo._4_4_;
  pipelineLayoutParams.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (*ppCVar17 == (Context *)0x0) {
    ppCVar17[2] = (Context *)uVar6;
    ppCVar17[3] = (Context *)VVar7;
    *ppCVar17 = (Context *)uVar3;
    ppCVar17[1] = (Context *)pvVar4;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)(pTVar15 + 0x16),(VkFence)*ppCVar17);
    ppCVar17[2] = (Context *)pipelineLayoutParams._16_8_;
    ppCVar17[3] = (Context *)pipelineLayoutParams.pSetLayouts;
    *ppCVar17 = (Context *)pipelineLayoutParams._0_8_;
    ppCVar17[1] = (Context *)pipelineLayoutParams.pNext;
    if (bufferCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&bufferCreateInfo.pNext,
                 (VkFence)bufferCreateInfo._0_8_);
    }
  }
  return pTVar15;
}

Assistant:

TestInstance* PushConstantComputeTest::createInstance (Context& context) const
{
	return new PushConstantComputeTestInstance(context, m_pushConstantRange);
}